

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  string local_60 [48];
  long local_30;
  size_t at;
  string *local_20;
  string *path_local;
  SymbolProperties *this_local;
  string *file;
  
  at._7_1_ = 0;
  local_20 = path;
  path_local = &this->Binary;
  this_local = (SymbolProperties *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  if ((this->ReportPath == 0) &&
     (local_30 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x7f4295),
     local_30 != -1)) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::GetFileName(const std::string& path) const
{
  std::string file(path);
  if (!this->ReportPath) {
    size_t at = file.rfind("/");
    if (at != std::string::npos) {
      file = file.substr(at + 1);
    }
  }
  return file;
}